

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_parse.c
# Opt level: O0

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int local_6c;
  char *pcStack_68;
  int yyi_1;
  char *yyp;
  long yysize1;
  int yyi;
  int yycount;
  long yysize;
  yysymbol_kind_t yyarg [5];
  char *yyformat;
  yypcontext_t *yyctx_local;
  char **yymsg_local;
  long *yymsg_alloc_local;
  
  stack0xffffffffffffffd0 = (char *)0x0;
  iVar2 = yy_syntax_error_arguments(yyctx,(yysymbol_kind_t *)&yysize,5);
  if (iVar2 == -2) {
    yymsg_alloc_local._4_4_ = -2;
  }
  else {
    switch(iVar2) {
    default:
      stack0xffffffffffffffd0 = "syntax error";
      break;
    case 1:
      stack0xffffffffffffffd0 = "syntax error, unexpected %s";
      break;
    case 2:
      stack0xffffffffffffffd0 = "syntax error, unexpected %s, expecting %s";
      break;
    case 3:
      stack0xffffffffffffffd0 = "syntax error, unexpected %s, expecting %s or %s";
      break;
    case 4:
      stack0xffffffffffffffd0 = "syntax error, unexpected %s, expecting %s or %s or %s";
      break;
    case 5:
      stack0xffffffffffffffd0 = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
    }
    sVar3 = strlen(stack0xffffffffffffffd0);
    _yyi = (sVar3 - (long)(iVar2 << 1)) + 1;
    for (yysize1._0_4_ = 0; (int)yysize1 < iVar2; yysize1._0_4_ = (int)yysize1 + 1) {
      lVar4 = yytnamerr((char *)0x0,yytname[yyarg[(long)(int)yysize1 + -2]]);
      if (_yyi + lVar4 < _yyi) {
        return -2;
      }
      _yyi = _yyi + lVar4;
    }
    if (*yymsg_alloc < _yyi) {
      *yymsg_alloc = _yyi << 1;
      if ((*yymsg_alloc < _yyi) || (0x7fffffffffffffff < *yymsg_alloc)) {
        *yymsg_alloc = 0x7fffffffffffffff;
      }
      yymsg_alloc_local._4_4_ = -1;
    }
    else {
      pcStack_68 = *yymsg;
      local_6c = 0;
      while (cVar1 = *stack0xffffffffffffffd0, *pcStack_68 = cVar1, cVar1 != '\0') {
        if (((*pcStack_68 == '%') && (stack0xffffffffffffffd0[1] == 's')) && (local_6c < iVar2)) {
          lVar4 = yytnamerr(pcStack_68,yytname[yyarg[(long)local_6c + -2]]);
          pcStack_68 = pcStack_68 + lVar4;
          stack0xffffffffffffffd0 = stack0xffffffffffffffd0 + 2;
          local_6c = local_6c + 1;
        }
        else {
          pcStack_68 = pcStack_68 + 1;
          stack0xffffffffffffffd0 = stack0xffffffffffffffd0 + 1;
        }
      }
      yymsg_alloc_local._4_4_ = 0;
    }
  }
  return yymsg_alloc_local._4_4_;
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}